

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interact.cc
# Opt level: O3

base_learner * interact_setup(options_i *options,vw *all)

{
  undefined4 uVar1;
  int iVar2;
  interact *__s;
  ostream *poVar3;
  base_learner *l;
  single_learner *__src;
  learner<interact,_example> *__dest;
  string s;
  size_type __dnew_1;
  option_group_definition new_options;
  size_type __dnew;
  _func_int ***local_190;
  _func_int **local_188;
  _func_int **local_180 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  long local_150;
  option_group_definition local_148;
  long *local_110;
  long local_108;
  long local_100 [2];
  string local_f0;
  undefined1 local_d0 [112];
  bool local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  local_170._M_string_length = 0;
  local_170.field_2._M_local_buf[0] = '\0';
  local_d0._0_8_ = (_func_int **)0x27;
  local_190 = local_180;
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  local_190 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_190,(ulong)local_d0);
  local_180[0] = (_func_int **)local_d0._0_8_;
  local_190[2] = (_func_int **)0x65736977746e656d;
  local_190[3] = (_func_int **)0x6c7069746c756d20;
  *(undefined4 *)local_190 = 0x65746e49;
  builtin_strncpy((char *)((long)local_190 + 4),"ract",4);
  *(undefined4 *)(local_190 + 1) = 0x61697620;
  builtin_strncpy((char *)((long)local_190 + 0xc)," ele",4);
  builtin_strncpy((char *)((long)local_190 + 0x1f),"lication",8);
  local_188 = (_func_int **)local_d0._0_8_;
  *(char *)((long)local_190 + local_d0._0_8_) = '\0';
  local_148.m_name._M_dataplus._M_p = (pointer)&local_148.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_148,local_190,(char *)(local_d0._0_8_ + (long)local_190));
  local_148.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_190 != local_180) {
    operator_delete(local_190);
  }
  local_f0.field_2._M_allocated_capacity = 0x7463617265746e69;
  local_f0._M_string_length = 8;
  local_f0.field_2._M_local_buf[8] = '\0';
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_d0,&local_f0,&local_170);
  local_60 = true;
  local_150 = 0x3d;
  local_110 = local_100;
  local_110 = (long *)std::__cxx11::string::_M_create((ulong *)&local_110,(ulong)&local_150);
  local_100[0] = local_150;
  builtin_strncpy((char *)((long)local_110 + 0x2d),"es <n1> ",8);
  builtin_strncpy((char *)((long)local_110 + 0x35),"and <n2>",8);
  local_110[4] = 0x6d616e206d6f7266;
  local_110[5] = 0x2073656361707365;
  local_110[2] = 0x7020657275746165;
  local_110[3] = 0x2073746375646f72;
  *local_110 = 0x6769657720747550;
  local_110[1] = 0x66206e6f20737468;
  local_108 = local_150;
  *(char *)((long)local_110 + local_150) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_d0 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (&local_148,
             (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_d0);
  if (local_110 != local_100) {
    operator_delete(local_110);
  }
  local_d0._0_8_ = &PTR__typed_option_002d6158;
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
  }
  if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_148);
  local_d0._16_8_ = 0x7463617265746e69;
  local_d0._8_8_ = (pointer)0x8;
  local_d0[0x18] = '\0';
  local_d0._0_8_ = local_d0 + 0x10;
  iVar2 = (*options->_vptr_options_i[1])(options);
  if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
    operator_delete((void *)local_d0._0_8_);
  }
  if ((char)iVar2 != '\0') {
    if (local_170._M_string_length == 2) {
      __s = calloc_or_throw<interact>(1);
      memset(__s,0,0x88);
      __s->n1 = *local_170._M_dataplus._M_p;
      __s->n2 = local_170._M_dataplus._M_p[1];
      if (all->quiet == false) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Interacting namespaces ",0x17);
        local_d0[0] = __s->n1;
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,local_d0,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," and ",5);
        local_d0[0] = __s->n2;
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_d0,1);
        std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
      }
      __s->all = all;
      l = setup_base(options,all);
      __src = LEARNER::as_singleline<char,char>(l);
      uVar1 = *(undefined4 *)(__src + 0xd0);
      __dest = calloc_or_throw<LEARNER::learner<interact,example>>(1);
      memcpy(__dest,__src,0xe9);
      *(single_learner **)(__dest + 0x20) = __src;
      *(code **)(__dest + 0x50) = LEARNER::recur_sensitivity;
      *(interact **)(__dest + 0xb8) = __s;
      *(single_learner **)(__dest + 0xc0) = __src;
      *(code **)(__dest + 200) = LEARNER::noop;
      *(undefined8 *)(__dest + 0xd8) = 1;
      *(undefined8 *)(__dest + 0xe0) = *(undefined8 *)(__src + 0xe0);
      *(interact **)(__dest + 0x18) = __s;
      *(code **)(__dest + 0x28) = predict_or_learn<true,true>;
      *(code **)(__dest + 0x38) = predict_or_learn<true,true>;
      *(code **)(__dest + 0x30) = predict_or_learn<false,true>;
      *(undefined8 *)(__dest + 0x40) = 0;
      *(undefined4 *)(__dest + 0xd0) = uVar1;
      __dest[0xe8] = (learner<interact,_example>)0x0;
      *(interact **)(__dest + 0xb8) = __s;
      *(single_learner **)(__dest + 0xc0) = __src;
      *(code **)(__dest + 200) = finish;
      goto LAB_001fb239;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Need two namespace arguments to interact: ",0x2a);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,local_170._M_dataplus._M_p,local_170._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," won\'t do EXITING\n",0x12);
  }
  __dest = (learner<interact,_example> *)0x0;
LAB_001fb239:
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_148.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148.m_name._M_dataplus._M_p != &local_148.m_name.field_2) {
    operator_delete(local_148.m_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  return (base_learner *)__dest;
}

Assistant:

LEARNER::base_learner* interact_setup(options_i& options, vw& all)
{
  string s;
  option_group_definition new_options("Interact via elementwise multiplication");
  new_options.add(
      make_option("interact", s).keep().help("Put weights on feature products from namespaces <n1> and <n2>"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("interact"))
    return nullptr;

  if (s.length() != 2)
  {
    cerr << "Need two namespace arguments to interact: " << s << " won't do EXITING\n";
    return nullptr;
  }

  auto data = scoped_calloc_or_throw<interact>();

  data->n1 = (unsigned char)s[0];
  data->n2 = (unsigned char)s[1];
  if (!all.quiet)
    cerr << "Interacting namespaces " << data->n1 << " and " << data->n2 << endl;
  data->all = &all;

  LEARNER::learner<interact, example>* l;
  l = &LEARNER::init_learner(
      data, as_singleline(setup_base(options, all)), predict_or_learn<true, true>, predict_or_learn<false, true>, 1);

  l->set_finish(finish);
  return make_base(*l);
}